

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O0

wchar_t rd_messages(void)

{
  short local_9c;
  uint16_t local_9a;
  char local_98 [4];
  int16_t num;
  uint16_t tmp16u;
  char buf [128];
  int local_c;
  wchar_t i;
  
  rd_s16b(&local_9c);
  for (local_c = 0; local_c < local_9c; local_c = local_c + 1) {
    rd_string(local_98,0x80);
    rd_u16b(&local_9a);
    message_add(local_98,local_9a);
  }
  return L'\0';
}

Assistant:

int rd_messages(void)
{
	int i;
	char buf[128];
	uint16_t tmp16u;

	int16_t num;

	/* Total */
	rd_s16b(&num);

	/* Read the messages */
	for (i = 0; i < num; i++) {
		/* Read the message */
		rd_string(buf, sizeof(buf));

		/* Read the message type */
		rd_u16b(&tmp16u);

		/* Save the message */
		message_add(buf, tmp16u);
	}

	return 0;
}